

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathsimplifier.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_e93b21::PathSimplifier::splitLineAt
          (PathSimplifier *this,
          QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *elements,BVHNode *node,
          quint32 pointIndex,bool processAgain)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QPoint *pQVar6;
  QPoint QVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Element *pEVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  bool bVar14;
  Element *pEVar15;
  Element *pEVar16;
  BVHNode *pBVar17;
  Element *pEVar18;
  long in_FS_OFFSET;
  Element *second;
  Element *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pEVar18 = (node->field_3).element;
  uVar1 = pEVar18->indices[0];
  uVar2 = pEVar18->indices[1];
  pQVar6 = this->m_points->buffer;
  iVar3 = pQVar6[pointIndex].xp.m_i;
  iVar4 = pQVar6[pointIndex].yp.m_i;
  if (((pQVar6[uVar1].xp.m_i == iVar3) && (pQVar6[uVar1].yp.m_i == iVar4)) ||
     ((pQVar6[uVar2].xp.m_i == iVar3 && (pQVar6[uVar2].yp.m_i == iVar4)))) {
    bVar14 = false;
  }
  else {
    if (processAgain) {
      pEVar18->field_0x39 = pEVar18->field_0x39 & 0xfe;
      pEVar18 = (node->field_3).element;
    }
    pEVar15 = ElementAllocator::newElement(&this->m_elementAllocator);
    uVar8 = *(undefined8 *)pEVar18->indices;
    uVar9 = *(undefined8 *)(pEVar18->indices + 2);
    pEVar16 = pEVar18->next;
    pEVar10 = pEVar18->previous;
    iVar3 = pEVar18->winding;
    uVar13 = *(undefined4 *)&pEVar18->field_0x2c;
    uVar11 = *(undefined8 *)((long)&pEVar18->winding + 2);
    uVar12 = *(undefined8 *)((long)&pEVar18->field_5 + 2);
    pEVar15->middle = pEVar18->middle;
    *(undefined8 *)pEVar15->indices = uVar8;
    *(undefined8 *)(pEVar15->indices + 2) = uVar9;
    pEVar15->next = pEVar16;
    pEVar15->previous = pEVar10;
    pEVar15->winding = iVar3;
    *(undefined4 *)&pEVar15->field_0x2c = uVar13;
    *(undefined8 *)((long)&pEVar15->winding + 2) = uVar11;
    *(undefined8 *)((long)&pEVar15->field_5 + 2) = uVar12;
    pEVar15->indices[0] = pointIndex;
    pEVar18->indices[1] = pointIndex;
    (pEVar18->middle).xp.m_i = pQVar6[pointIndex].xp.m_i + pQVar6[uVar1].xp.m_i >> 1;
    (pEVar18->middle).yp.m_i = pQVar6[pointIndex].yp.m_i + pQVar6[uVar1].yp.m_i >> 1;
    (pEVar15->middle).xp.m_i = pQVar6[pointIndex].xp.m_i + pQVar6[uVar2].xp.m_i >> 1;
    (pEVar15->middle).yp.m_i = pQVar6[pointIndex].yp.m_i + pQVar6[uVar2].yp.m_i >> 1;
    local_40 = pEVar15;
    QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::add(&this->m_elements,&local_40);
    pEVar16 = (Element *)BoundingVolumeHierarchy::newNode(&this->m_bvh);
    pBVar17 = BoundingVolumeHierarchy::newNode(&this->m_bvh);
    pBVar17->type = Leaf;
    (pEVar16->middle).xp.m_i = Leaf;
    ((anon_union_8_2_70fb368a_for_Node_4 *)&pEVar16->next)->element = pEVar18;
    (pBVar17->field_3).element = pEVar15;
    QVar7 = node->minimum;
    pBVar17->minimum = QVar7;
    *(QPoint *)&(pEVar16->middle).yp = QVar7;
    QVar7 = node->maximum;
    pBVar17->maximum = QVar7;
    *(QPoint *)((Representation *)pEVar16->indices + 1) = QVar7;
    iVar4 = pQVar6[uVar1].xp.m_i;
    iVar3 = pQVar6[uVar2].xp.m_i;
    iVar5 = pQVar6[pointIndex].xp.m_i;
    (&pBVar17->minimum)[iVar3 <= iVar4].xp.m_i = iVar5;
    ((Representation *)pEVar16->indices)[(ulong)(iVar4 < iVar3) * 2 + -1].m_i = iVar5;
    iVar4 = pQVar6[uVar1].yp.m_i;
    iVar3 = pQVar6[uVar2].yp.m_i;
    iVar5 = pQVar6[pointIndex].yp.m_i;
    (&pBVar17->minimum)[iVar3 <= iVar4].yp.m_i = iVar5;
    ((Representation *)pEVar16->indices)[(ulong)(iVar4 < iVar3) * 2].m_i = iVar5;
    *(Element **)&((anon_union_8_2_70fb368a_for_Node_4 *)&pEVar16->next)->left[1].minimum.yp =
         pEVar16;
    *(BVHNode **)&(pBVar17->field_3).left[1].minimum.yp = pBVar17;
    node->type = Split;
    (node->field_3).element = pEVar16;
    node->right = pBVar17;
    if ((pEVar18->field_0x39 & 1) == 0) {
      QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::add
                (elements,&((anon_union_8_2_70fb368a_for_Node_4 *)&pEVar16->next)->element);
      QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::add
                (elements,&(pBVar17->field_3).element);
    }
    bVar14 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar14;
  }
  __stack_chk_fail();
}

Assistant:

bool PathSimplifier::splitLineAt(QDataBuffer<Element *> &elements, BVHNode *node,
                                 quint32 pointIndex, bool processAgain)
{
    Q_ASSERT(node->type == BVHNode::Leaf);
    Element *element = node->element;
    Q_ASSERT(element->degree == Element::Line);
    const QPoint &u = m_points->at(element->indices[0]);
    const QPoint &v = m_points->at(element->indices[1]);
    const QPoint &p = m_points->at(pointIndex);
    if (u == p || v == p)
        return false; // No split needed.

    if (processAgain)
        element->processed = false; // Needs to be processed again.

    Element *first = node->element;
    Element *second = m_elementAllocator.newElement();
    *second = *first;
    first->indices[1] = second->indices[0] = pointIndex;
    first->middle.rx() = (u.x() + p.x()) >> 1;
    first->middle.ry() = (u.y() + p.y()) >> 1;
    second->middle.rx() = (v.x() + p.x()) >> 1;
    second->middle.ry() = (v.y() + p.y()) >> 1;
    m_elements.add(second);

    BVHNode *left = m_bvh.newNode();
    BVHNode *right = m_bvh.newNode();
    left->type = right->type = BVHNode::Leaf;
    left->element = first;
    right->element = second;
    left->minimum = right->minimum = node->minimum;
    left->maximum = right->maximum = node->maximum;
    if (u.x() < v.x())
        left->maximum.rx() = right->minimum.rx() = p.x();
    else
        left->minimum.rx() = right->maximum.rx() = p.x();
    if (u.y() < v.y())
        left->maximum.ry() = right->minimum.ry() = p.y();
    else
        left->minimum.ry() = right->maximum.ry() = p.y();
    left->element->bvhNode = left;
    right->element->bvhNode = right;

    node->type = BVHNode::Split;
    node->left = left;
    node->right = right;

    if (!first->processed) {
        elements.add(left->element);
        elements.add(right->element);
    }
    return true;
}